

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomUpdateView.cpp
# Opt level: O2

void __thiscall RoomUpdateView::display(RoomUpdateView *this)

{
  ModelForm<Room> *this_00;
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int strength;
  Room *passedInstance;
  RoomCreateUpdateForm *this_01;
  undefined4 extraout_var;
  ostream *poVar5;
  Controller *this_02;
  View *pVVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::operator<<((ostream *)&std::cout,"To update a room fill in the details asked below: \n");
  std::operator<<((ostream *)&std::cout,"Enter room number: ");
  iVar4 = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Enter strength: ");
  strength = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Audio required? (y/n): ");
  cVar1 = Input::getChar();
  std::operator<<((ostream *)&std::cout,"Video required? (y/n): ");
  cVar2 = Input::getChar();
  passedInstance = Room::findByRoomNumber(iVar4);
  if (passedInstance == (Room *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"The room #");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::operator<<(poVar5," doesn\'t exist.\n");
  }
  else {
    this_01 = (RoomCreateUpdateForm *)operator_new(0x38);
    RoomCreateUpdateForm::RoomCreateUpdateForm
              (this_01,iVar4,strength,cVar1 == 'y',cVar2 == 'y',passedInstance);
    (this->super_UpdateView<Room>).form = (ModelForm<Room> *)this_01;
    bVar3 = Form::isValid((Form *)this_01);
    this_00 = (this->super_UpdateView<Room>).form;
    if (bVar3) {
      iVar4 = (*(this_00->super_Form)._vptr_Form[1])();
      iVar4 = Room::getRoomNumber((Room *)CONCAT44(extraout_var,iVar4));
      std::__cxx11::to_string(&local_50,iVar4);
      std::operator+(&local_70,"Room #",&local_50);
      std::operator+(&local_90,&local_70," updated successfully.\n");
      std::operator<<((ostream *)&std::cout,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      Form::printErrors(&this_00->super_Form);
    }
  }
  this_02 = Controller::getInstance();
  std::__cxx11::string::string((string *)&local_90,"admin-panel",(allocator *)&local_70);
  pVVar6 = Controller::getView(this_02,&local_90);
  View::response->view = pVVar6;
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void RoomUpdateView::display() {
    cout << "To update a room fill in the details asked below: \n";
    int roomNumber, strength;
    bool audio, video;
    cout << "Enter room number: ";
    roomNumber = Input::getInt();
    cout << "Enter strength: ";
    strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    video = (Input::getChar() == 'y');
    Room *room = Room::findByRoomNumber(roomNumber);
    if (room) {
        form = new RoomCreateUpdateForm(roomNumber, strength, audio, video, room);
        if (form->isValid()) {
            room = &form->save();
            cout << "Room #" + to_string(room->getRoomNumber()) + " updated successfully.\n";
        } else {
            form->printErrors();
        }
    } else {
        cout << "The room #" << roomNumber << " doesn't exist.\n";
    }
    response->view = Controller::getInstance().getView("admin-panel");
}